

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall
ktx::CommandCreate::checkSpecsMatch
          (CommandCreate *this,ImageInput *currentFile,ImageSpec *firstSpec)

{
  bool bVar1;
  khr_df_transfer_e kVar2;
  khr_df_transfer_e kVar3;
  khr_df_primaries_e kVar4;
  khr_df_primaries_e kVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ImageSpec *pIVar8;
  ReturnCode extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  Origin *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3_00;
  ImageSpec *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar9;
  float fVar10;
  string firstGamma;
  string currentGamma;
  FormatDescriptor *currentFormat;
  FormatDescriptor *firstFormat;
  float in_stack_fffffffffffffb9c;
  Origin *in_stack_fffffffffffffbb8;
  allocator<char> *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  Reporter *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  Reporter *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  char (*in_stack_fffffffffffffc18) [178];
  undefined8 in_stack_fffffffffffffc20;
  ReturnCode return_code;
  Reporter *in_stack_fffffffffffffc28;
  Origin local_2c8 [10];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [32];
  Reporter local_1e8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [38];
  byte local_142;
  allocator<char> local_141;
  string local_140 [38];
  byte local_11a;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [48];
  string local_68 [32];
  string local_48 [32];
  FormatDescriptor *local_28;
  FormatDescriptor *local_20;
  ImageSpec *local_18;
  long *local_10;
  
  return_code = (ReturnCode)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = ImageSpec::format(in_RDX);
  pIVar8 = (ImageSpec *)(**(code **)(*local_10 + 0x70))();
  local_28 = ImageSpec::format(pIVar8);
  kVar2 = FormatDescriptor::transfer((FormatDescriptor *)0x1e215f);
  kVar3 = FormatDescriptor::transfer((FormatDescriptor *)0x1e2173);
  if (kVar2 != kVar3) {
    bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e219c);
    if (bVar1) {
      (**(code **)(*local_10 + 0x68))();
      FormatDescriptor::transfer((FormatDescriptor *)0x1e21df);
      toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      FormatDescriptor::transfer((FormatDescriptor *)0x1e2203);
      toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      Reporter::
      warning<char_const(&)[152],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffc08,(char (*) [152])in_stack_fffffffffffffc00,
                 &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
    else {
      bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e22b2)
      ;
      if (bVar1) {
        (**(code **)(*local_10 + 0x68))();
        FormatDescriptor::transfer((FormatDescriptor *)0x1e22f5);
        toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        FormatDescriptor::transfer((FormatDescriptor *)0x1e2319);
        toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        Reporter::
        warning<char_const(&)[214],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc08,(char (*) [214])in_stack_fffffffffffffc00,
                   &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_98);
      }
      else {
        (**(code **)(*local_10 + 0x68))();
        FormatDescriptor::transfer((FormatDescriptor *)0x1e23ea);
        toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        FormatDescriptor::transfer((FormatDescriptor *)0x1e240e);
        toString_abi_cxx11_((khr_df_transfer_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        Reporter::
        fatal<char_const(&)[154],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc28,return_code,(char (*) [154])in_stack_fffffffffffffc18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   &in_stack_fffffffffffffc08->commandName,in_stack_fffffffffffffc00);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_d8);
      }
    }
  }
  fVar9 = FormatDescriptor::oeGamma(local_28);
  fVar10 = FormatDescriptor::oeGamma(local_20);
  if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
    fVar9 = FormatDescriptor::oeGamma(local_28);
    local_11a = 0;
    if ((fVar9 != -1.0) || (NAN(fVar9))) {
      FormatDescriptor::oeGamma(local_28);
      std::__cxx11::to_string(in_stack_fffffffffffffb9c);
    }
    else {
      std::allocator<char>::allocator();
      local_11a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    }
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    fVar9 = FormatDescriptor::oeGamma(local_20);
    local_142 = 0;
    if ((fVar9 != -1.0) || (NAN(fVar9))) {
      FormatDescriptor::oeGamma(local_20);
      std::__cxx11::to_string(in_stack_fffffffffffffb9c);
    }
    else {
      std::allocator<char>::allocator();
      local_142 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    }
    if ((local_142 & 1) != 0) {
      std::allocator<char>::~allocator(&local_141);
    }
    bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e2630);
    if (bVar1) {
      (**(code **)(*local_10 + 0x68))();
      Reporter::
      warning<char_const(&)[140],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                (in_stack_fffffffffffffc08,(char (*) [140])in_stack_fffffffffffffc00,
                 &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
    }
    else {
      bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e2756)
      ;
      if (bVar1) {
        (**(code **)(*local_10 + 0x68))();
        Reporter::
        warning<char_const(&)[202],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                  (in_stack_fffffffffffffc08,(char (*) [202])in_stack_fffffffffffffc00,
                   &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8);
      }
      else {
        (**(code **)(*local_10 + 0x68))();
        Reporter::
        fatal<char_const(&)[142],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
                  (in_stack_fffffffffffffc28,return_code,(char (*) [142])in_stack_fffffffffffffc18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   &in_stack_fffffffffffffc08->commandName,in_stack_fffffffffffffc00);
      }
    }
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_118);
  }
  kVar4 = FormatDescriptor::primaries((FormatDescriptor *)0x1e285c);
  kVar5 = FormatDescriptor::primaries((FormatDescriptor *)0x1e2870);
  if (kVar4 != kVar5) {
    bVar1 = std::optional<_khr_df_primaries_e>::has_value((optional<_khr_df_primaries_e> *)0x1e2899)
    ;
    if (bVar1) {
      (**(code **)(*local_10 + 0x68))();
      FormatDescriptor::primaries((FormatDescriptor *)0x1e28dc);
      toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      FormatDescriptor::primaries((FormatDescriptor *)0x1e2900);
      toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      Reporter::
      warning<char_const(&)[151],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffc08,(char (*) [151])in_stack_fffffffffffffc00,
                 &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_168);
    }
    else {
      bVar1 = std::optional<_khr_df_primaries_e>::has_value
                        ((optional<_khr_df_primaries_e> *)0x1e29af);
      if (bVar1) {
        (**(code **)(*local_10 + 0x68))();
        FormatDescriptor::primaries((FormatDescriptor *)0x1e29f2);
        toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        FormatDescriptor::primaries((FormatDescriptor *)0x1e2a16);
        toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        Reporter::
        warning<char_const(&)[197],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc08,(char (*) [197])in_stack_fffffffffffffc00,
                   &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::~string((string *)&local_1e8.commandDescription);
        std::__cxx11::string::~string(local_1a8);
      }
      else {
        in_stack_fffffffffffffc18 = (char (*) [178])(in_RDI + 8);
        (**(code **)(*local_10 + 0x68))();
        return_code = extraout_var;
        FormatDescriptor::primaries((FormatDescriptor *)0x1e2ae7);
        in_stack_fffffffffffffc28 = &local_1e8;
        toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        FormatDescriptor::primaries((FormatDescriptor *)0x1e2b0b);
        toString_abi_cxx11_((khr_df_primaries_e)((ulong)in_stack_fffffffffffffc00 >> 0x20));
        Reporter::
        fatal<char_const(&)[160],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc28,return_code,(char (*) [160])in_stack_fffffffffffffc18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   &in_stack_fffffffffffffc08->commandName,in_stack_fffffffffffffc00);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
  }
  uVar6 = FormatDescriptor::channelCount(local_28);
  uVar7 = FormatDescriptor::channelCount(local_20);
  if (uVar6 != uVar7) {
    in_stack_fffffffffffffc08 = (Reporter *)(in_RDI + 8);
    (**(code **)(*local_10 + 0x68))();
    Reporter::warning<char_const(&)[71],std::__cxx11::string_const&>
              (in_stack_fffffffffffffbf8,(char (*) [71])in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8);
  }
  pIVar8 = (ImageSpec *)(**(code **)(*local_10 + 0x70))();
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ImageSpec::origin(pIVar8);
  rhs = ImageSpec::origin(local_18);
  bVar1 = ::operator!=((Origin *)args_3,rhs);
  if (bVar1) {
    bVar1 = std::optional<ImageSpec::Origin>::has_value((optional<ImageSpec::Origin> *)0x1e2c59);
    if (bVar1) {
      args_3_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (**(code **)(*local_10 + 0x68))();
      pIVar8 = (ImageSpec *)(**(code **)(*local_10 + 0x70))();
      ImageSpec::origin(pIVar8);
      args_2 = &local_228;
      ::toString_abi_cxx11_(in_stack_fffffffffffffbb8);
      ImageSpec::origin(local_18);
      args_1 = &local_248;
      ::toString_abi_cxx11_(in_stack_fffffffffffffbb8);
      Reporter::
      warning<char_const(&)[163],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffc08,(char (*) [163])args_3,args_1,args_2,args_3_00);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_228);
    }
    else {
      bVar1 = std::optional<ImageSpec::Origin>::has_value((optional<ImageSpec::Origin> *)0x1e2d65);
      if (bVar1) {
        (**(code **)(*local_10 + 0x68))();
        pIVar8 = (ImageSpec *)(**(code **)(*local_10 + 0x70))();
        ImageSpec::origin(pIVar8);
        ::toString_abi_cxx11_(in_stack_fffffffffffffbb8);
        ImageSpec::origin(local_18);
        ::toString_abi_cxx11_(in_stack_fffffffffffffbb8);
        Reporter::
        warning<char_const(&)[203],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc08,(char (*) [203])args_3,
                   &in_stack_fffffffffffffbf8->commandName,in_stack_fffffffffffffbf0,
                   in_stack_fffffffffffffbe8);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::string::~string(local_268);
      }
      else {
        (**(code **)(*local_10 + 0x68))();
        pIVar8 = (ImageSpec *)(**(code **)(*local_10 + 0x70))();
        ImageSpec::origin(pIVar8);
        ::toString_abi_cxx11_(in_stack_fffffffffffffbb8);
        ImageSpec::origin(local_18);
        ::toString_abi_cxx11_(local_2c8);
        Reporter::
        fatal<char_const(&)[178],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffc28,return_code,in_stack_fffffffffffffc18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar6,in_stack_fffffffffffffc10),&in_stack_fffffffffffffc08->commandName
                   ,args_3);
        std::__cxx11::string::~string((string *)local_2c8);
        std::__cxx11::string::~string(local_2a8);
      }
    }
  }
  return;
}

Assistant:

void CommandCreate::checkSpecsMatch(const ImageInput& currentFile, const ImageSpec& firstSpec) {
    const FormatDescriptor& firstFormat = firstSpec.format();
    const FormatDescriptor& currentFormat = currentFile.spec().format();

    if (currentFormat.transfer() != firstFormat.transfer()) {
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different transfer function ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different transfer function ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.transfer()), toString(firstFormat.transfer()));
        }
    }

    if (currentFormat.oeGamma() != firstFormat.oeGamma()) {
        auto currentGamma = currentFormat.oeGamma() != -1 ? std::to_string(currentFormat.oeGamma()) : "no gamma";
        auto firstGamma = firstFormat.oeGamma() != -1 ? std::to_string(firstFormat.oeGamma()) : "no gamma";
        if (options.assignTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else if (options.convertTF.has_value()) {
            warning("Input image \"{}\" has different gamma ({}) than the first image ({})"
                " and thus will go through different transfer function conversion to the target transfer"
                " function specified by the --convert-tf option.",
                currentFile.filename(), currentGamma, firstGamma);
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different gamma ({}) than the first image ({})."
                " Use --assign-tf or --convert-tf to specify handling and stop this error.",
                currentFile.filename(), currentGamma, firstGamma);
        }
    }

    if (currentFormat.primaries() != firstFormat.primaries()) {
        if (options.assignPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else if (options.convertPrimaries.has_value()) {
            warning("Input image \"{}\" has different primaries ({}) than the first image ({})"
                " and thus will go through different primaries conversion to the target primaries"
                " specified by the --convert-primaries option.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different primaries ({}) than the first image ({})."
                " Use --assign-primaries or --convert-primaries to specify handling and stop this error.",
                currentFile.filename(), toString(currentFormat.primaries()), toString(firstFormat.primaries()));
        }
    }

    if (currentFormat.channelCount() != firstFormat.channelCount()) {
        warning("Input image \"{}\" has a different component count than the first image.", currentFile.filename());
    }

    if (currentFile.spec().origin() != firstSpec.origin()) {
        if (options.assignTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " but will be treated identically as specified by the --assign-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else if (options.convertTexcoordOrigin.has_value()) {
            warning("Input image \"{}\" has different texcoord origin ({}) than the first image ({})"
                " and thus will go through different origin conversion to the target origin"
                " specified by the --convert-texcoord-origin option.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        } else {
            fatal(rc::INVALID_FILE, "Input image \"{}\" has different texcoord origin ({}) than the first image ({})."
                " Use --assign-texcoord-origin or --convert-texcoord-origin to specify handling and stop this error.",
                currentFile.filename(), toString(currentFile.spec().origin()), toString(firstSpec.origin()));
        }
    }
}